

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O0

bool leccalc::setupoutputfiles
               (FILE **fout,bool ordFlag,bool *outputFlags,bool skipheader,
               vector<int,_std::allocator<int>_> *fileIDs_occ,
               vector<int,_std::allocator<int>_> *fileIDs_agg,aggreports *agg)

{
  allocator<int> *paVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  byte bVar2;
  bool bVar3;
  reference piVar4;
  size_type sVar5;
  size_type sVar6;
  FILE *pFVar7;
  size_t sVar8;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> __result;
  reference piVar9;
  undefined8 uVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1e0;
  iterator it_2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1d0;
  iterator it_1;
  undefined1 local_198 [8];
  vector<int,_std::allocator<int>_> fileIDs;
  Ensemble e;
  FILE *fin;
  string fileHeader_psept;
  string local_150 [8];
  string fileHeader_ept;
  value_type_conflict local_12c;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_128;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_120;
  const_iterator it;
  vector<int,_std::allocator<int>_> fileIDs_psept;
  int local_f8 [2];
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> handles_psept;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> handles_occ;
  allocator<int> local_7d;
  int local_7c [3];
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  vector<int,_std::allocator<int>_> handles_agg;
  bool hasEPT;
  vector<int,_std::allocator<int>_> *fileIDs_agg_local;
  vector<int,_std::allocator<int>_> *fileIDs_occ_local;
  bool skipheader_local;
  bool *outputFlags_local;
  bool ordFlag_local;
  FILE **fout_local;
  
  handles_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_7c[0] = 0;
  local_7c[1] = 2;
  local_7c[2] = 3;
  local_70 = local_7c;
  local_68 = 3;
  std::allocator<int>::allocator(&local_7d);
  __l_01._M_len = local_68;
  __l_01._M_array = local_70;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_60,__l_01,&local_7d);
  std::allocator<int>::~allocator(&local_7d);
  getfileids(fout,(vector<int,_std::allocator<int>_> *)local_60,ordFlag,outputFlags,fileIDs_agg,
             (bool *)((long)&handles_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
  handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 4;
  paVar1 = (allocator<int> *)
           ((long)&handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  __l_00._M_len = 3;
  __l_00._M_array =
       (iterator)
       ((long)&handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,__l_00,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&handles_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  getfileids(fout,(vector<int,_std::allocator<int>_> *)local_a8,ordFlag,outputFlags,fileIDs_occ,
             (bool *)((long)&handles_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
  local_f8[0] = 1;
  local_f8[1] = 5;
  local_f0 = local_f8;
  local_e8 = 2;
  paVar1 = (allocator<int> *)
           ((long)&fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e0,__l,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&fileIDs_psept.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&it);
  local_120._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_e0);
  while( true ) {
    local_128._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_e0);
    bVar3 = __gnu_cxx::operator!=(&local_120,&local_128);
    if (!bVar3) break;
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_120);
    if ((outputFlags[*piVar4] & 1U) != 0) {
      piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_120);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&it,piVar4);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_120);
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&it);
  if (((sVar5 != 0) && (ordFlag)) &&
     (std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&it),
     fout[1] != (FILE *)0x0)) {
    local_12c = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&it,&local_12c);
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size(fileIDs_occ);
  sVar6 = std::vector<int,_std::allocator<int>_>::size(fileIDs_agg);
  if (sVar5 + sVar6 != 0) {
    if (ordFlag) {
      aggreports::SetORDOutputFunc(agg,0);
    }
    else {
      aggreports::SetLegacyOutputFunc(agg,0);
    }
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&it);
  if (sVar5 != 0) {
    if (ordFlag) {
      aggreports::SetORDOutputFunc(agg,1);
    }
    else {
      aggreports::SetLegacyOutputFunc(agg,1);
    }
  }
  bVar2 = handles_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._7_1_;
  if (!skipheader) {
    std::__cxx11::string::string(local_150);
    std::__cxx11::string::string((string *)&fin);
    if (ordFlag) {
      std::__cxx11::string::operator=(local_150,"SummaryId,EPCalc,EPType,ReturnPeriod,Loss");
      std::__cxx11::string::operator=((string *)&fin,"SummaryId,SampleId,EPType,ReturnPeriod,Loss");
    }
    else {
      std::__cxx11::string::operator=(local_150,"summary_id,type,return_period,loss");
      std::__cxx11::string::operator=((string *)&fin,"summary_id,sidx,return_period,loss");
      pFVar7 = fopen("input/ensemble.bin","rb");
      if (pFVar7 != (FILE *)0x0) {
        sVar8 = fread(&fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,8,1,pFVar7);
        if (sVar8 != 0) {
          std::__cxx11::string::operator+=(local_150,",ensemble_id");
          std::__cxx11::string::operator+=((string *)&fin,",ensemble_id");
        }
        fclose(pFVar7);
      }
    }
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_198);
    __first1 = std::vector<int,_std::allocator<int>_>::begin(fileIDs_agg);
    __last1 = std::vector<int,_std::allocator<int>_>::end(fileIDs_agg);
    __first2 = std::vector<int,_std::allocator<int>_>::begin(fileIDs_occ);
    __last2 = std::vector<int,_std::allocator<int>_>::end(fileIDs_occ);
    __result = std::back_inserter<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)local_198);
    it_1._M_current =
         (int *)std::
                set_union<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
                          (__first1._M_current,__last1._M_current,__first2._M_current,
                           __last2._M_current,__result);
    local_1d0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_198);
    while( true ) {
      it_2 = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_198);
      bVar3 = __gnu_cxx::operator!=(&local_1d0,&it_2);
      if (!bVar3) break;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_1d0);
      pFVar7 = (FILE *)fout[*piVar9];
      uVar10 = std::__cxx11::string::c_str();
      fprintf(pFVar7,"%s\n",uVar10);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1d0);
    }
    local_1e0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)&it);
    while( true ) {
      local_1e8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)&it);
      bVar3 = __gnu_cxx::operator!=(&local_1e0,&local_1e8);
      bVar2 = handles_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_;
      if (!bVar3) break;
      piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_1e0);
      pFVar7 = (FILE *)fout[*piVar9];
      uVar10 = std::__cxx11::string::c_str();
      fprintf(pFVar7,"%s\n",uVar10);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1e0);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_198);
    std::__cxx11::string::~string((string *)&fin);
    std::__cxx11::string::~string(local_150);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_e0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  return (bool)(bVar2 & 1);
}

Assistant:

inline bool setupoutputfiles(FILE **fout, const bool ordFlag,
				     const bool *outputFlags,
				     const bool skipheader,
				     std::vector<int> &fileIDs_occ,
				     std::vector<int> &fileIDs_agg,
				     aggreports &agg)
	{
		bool hasEPT = false;

		// Get list of aggregate and occurrence output files
		const std::vector<int> handles_agg = { AGG_FULL_UNCERTAINTY,
						       AGG_SAMPLE_MEAN,
						       AGG_WHEATSHEAF_MEAN };
		getfileids(fout, handles_agg, ordFlag, outputFlags,
			   fileIDs_agg, hasEPT);

		const std::vector<int> handles_occ = { OCC_FULL_UNCERTAINTY,
						       OCC_SAMPLE_MEAN,
						       OCC_WHEATSHEAF_MEAN };
		getfileids(fout, handles_occ, ordFlag, outputFlags,
			   fileIDs_occ, hasEPT);

		const std::vector<int> handles_psept = { AGG_WHEATSHEAF,
							 OCC_WHEATSHEAF };
		std::vector<int> fileIDs_psept;
		for (auto it = handles_psept.begin(); it != handles_psept.end();
		     ++it) {
			if (outputFlags[*it]) fileIDs_psept.push_back(*it);
		}
		if (fileIDs_psept.size() > 0 && ordFlag) {
			fileIDs_psept.clear();
			if (fout[PSEPT] != nullptr)
				fileIDs_psept.push_back(PSEPT);
		}

		// Set write csv functions
		if ((fileIDs_occ.size() + fileIDs_agg.size()) > 0) {
			if (ordFlag) agg.SetORDOutputFunc(EPT);
			else agg.SetLegacyOutputFunc(EPT);
		}
		if (fileIDs_psept.size() > 0) {
			if (ordFlag) agg.SetORDOutputFunc(PSEPT);
			else agg.SetLegacyOutputFunc(PSEPT);
		}

		if (skipheader) return hasEPT;   // No header

		// Set file headers
		std::string fileHeader_ept;
		std::string fileHeader_psept;
		if (ordFlag) {
			fileHeader_ept = "SummaryId,EPCalc,EPType,ReturnPeriod,"
					 "Loss";
			fileHeader_psept = "SummaryId,SampleId,EPType,"
					   "ReturnPeriod,Loss";
		} else {
			fileHeader_ept = "summary_id,type,return_period,loss";
			fileHeader_psept = "summary_id,sidx,return_period,loss";
			FILE *fin = fopen(ENSEMBLE_FILE, "rb");
			if (fin != nullptr) {
				Ensemble e;
				// If there is at least one entry
				if (fread(&e, sizeof(Ensemble), 1, fin) != 0) {
					fileHeader_ept += ",ensemble_id";
					fileHeader_psept += ",ensemble_id";
				}
				fclose(fin);
			}
		}

		// Print headers for Exceedance Probability Table
		// (i.e. full uncertainty, sample mean and Wheatsheaf mean)
		std::vector<int> fileIDs;
		std::set_union(fileIDs_agg.begin(), fileIDs_agg.end(),
			       fileIDs_occ.begin(), fileIDs_occ.end(),
			       std::back_inserter(fileIDs));
		for (auto it = fileIDs.begin(); it != fileIDs.end(); ++it) {
			fprintf(fout[*it], "%s\n", fileHeader_ept.c_str());
		}

		// Print headers for Per Sample Exceedance Probability Table
		// (i.e. Wheatsheaf)
		for (auto it = fileIDs_psept.begin(); it != fileIDs_psept.end();
		     ++it) {
			fprintf(fout[*it], "%s\n", fileHeader_psept.c_str());
		}

		return hasEPT;
	}